

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTDMT_compressCCtx(ZSTDMT_CCtx *mtctx,void *dst,size_t dstCapacity,void *src,size_t srcSize,
                          int compressionLevel)

{
  ZSTD_parameters params_00;
  int overlapLog;
  size_t sVar1;
  ZSTD_parameters params;
  ZSTD_compressionParameters local_58;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  undefined4 uStack_34;
  
  ZSTD_getCParams_internal(&local_58,compressionLevel,-(ulong)(srcSize == 0) | srcSize,0);
  uStack_38 = 0;
  uStack_34 = 0;
  overlapLog = 6;
  if (local_58.strategy - ZSTD_lazy2 < 5) {
    overlapLog = *(int *)(&DAT_001a1060 + (ulong)(local_58.strategy - ZSTD_lazy2) * 4);
  }
  uStack_3c = 1;
  params_00.fParams.contentSizeFlag = 1;
  params_00.cParams.strategy = local_58.strategy;
  params_00.cParams.hashLog = local_58.hashLog;
  params_00.cParams.searchLog = local_58.searchLog;
  params_00.cParams.windowLog = local_58.windowLog;
  params_00.cParams.chainLog = local_58.chainLog;
  params_00.cParams.minMatch = local_58.minMatch;
  params_00.cParams.targetLength = local_58.targetLength;
  params_00.fParams.checksumFlag = 0;
  params_00.fParams.noDictIDFlag = 0;
  sVar1 = ZSTDMT_compress_advanced
                    (mtctx,dst,dstCapacity,src,srcSize,(ZSTD_CDict *)0x0,params_00,overlapLog);
  return sVar1;
}

Assistant:

size_t ZSTDMT_compressCCtx(ZSTDMT_CCtx* mtctx,
                           void* dst, size_t dstCapacity,
                     const void* src, size_t srcSize,
                           int compressionLevel)
{
    ZSTD_parameters params = ZSTD_getParams(compressionLevel, srcSize, 0);
    int const overlapLog = ZSTDMT_overlapLog_default(params.cParams.strategy);
    params.fParams.contentSizeFlag = 1;
    return ZSTDMT_compress_advanced(mtctx, dst, dstCapacity, src, srcSize, NULL, params, overlapLog);
}